

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

void __thiscall Diligent::DescriptorSetAllocation::Release(DescriptorSetAllocation *this)

{
  Char *Message;
  char (*in_RCX) [55];
  undefined1 local_30 [8];
  string msg;
  DescriptorSetAllocation *this_local;
  
  if (this->Set != (VkDescriptorSet)0x0) {
    msg.field_2._8_8_ = this;
    if ((this->DescrSetAllocator == (DescriptorSetAllocator *)0x0) ||
       (this->Pool == (VkDescriptorPool)0x0)) {
      FormatString<char[26],char[55]>
                ((string *)local_30,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DescrSetAllocator != nullptr && Pool != VK_NULL_HANDLE",in_RCX);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"Release",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
                 ,0x27);
      std::__cxx11::string::~string((string *)local_30);
    }
    DescriptorSetAllocator::FreeDescriptorSet
              (this->DescrSetAllocator,this->Set,this->Pool,this->CmdQueueMask);
    Reset(this);
  }
  return;
}

Assistant:

void DescriptorSetAllocation::Release()
{
    if (Set != VK_NULL_HANDLE)
    {
        VERIFY_EXPR(DescrSetAllocator != nullptr && Pool != VK_NULL_HANDLE);
        DescrSetAllocator->FreeDescriptorSet(Set, Pool, CmdQueueMask);

        Reset();
    }
}